

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

void Wasm::WasmBytecodeGenerator::GenerateFunctionBytecode
               (ScriptContext *scriptContext,WasmReaderInfo *readerinfo,bool validateOnly)

{
  undefined1 local_180 [8];
  WasmBytecodeGenerator generator;
  
  WasmBytecodeGenerator((WasmBytecodeGenerator *)local_180,scriptContext,readerinfo,validateOnly);
  GenerateFunction((WasmBytecodeGenerator *)local_180);
  ~WasmBytecodeGenerator((WasmBytecodeGenerator *)local_180);
  return;
}

Assistant:

void WasmBytecodeGenerator::GenerateFunctionBytecode(Js::ScriptContext* scriptContext, WasmReaderInfo* readerinfo, bool validateOnly /*= false*/)
{
    WasmBytecodeGenerator generator(scriptContext, readerinfo, validateOnly);
    generator.GenerateFunction();
}